

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void dbg_print_buf(void *buf,uint64_t buflen,bool hex,int align)

{
  int in_ECX;
  byte in_DL;
  ulong in_RSI;
  long in_RDI;
  size_t j;
  size_t i;
  char local_39;
  ulong local_28;
  ulong local_20;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"(null)\n");
  }
  else if ((in_DL & 1) == 0) {
    fprintf(_stderr,"%.*s\n",in_RSI & 0xffffffff,in_RDI);
  }
  else {
    fprintf(_stderr,"(hex) 0x%lx, %lu (0x%lx) bytes\n",in_RDI,in_RSI,in_RSI);
    for (local_20 = 0; local_20 < in_RSI; local_20 = (long)in_ECX + local_20) {
      fprintf(_stderr,"   %04x   ",local_20 & 0xffffffff);
      for (local_28 = local_20; local_28 < local_20 + (long)in_ECX; local_28 = local_28 + 1) {
        if (local_28 < in_RSI) {
          fprintf(_stderr,"%02x ",(ulong)*(byte *)(in_RDI + local_28));
        }
        else {
          fprintf(_stderr,"   ");
        }
        if ((local_28 + 1 & 7) == 0) {
          fprintf(_stderr," ");
        }
      }
      fprintf(_stderr," ");
      for (local_28 = local_20; local_28 < local_20 + (long)in_ECX && local_28 < in_RSI;
          local_28 = local_28 + 1) {
        if ((*(char *)(in_RDI + local_28) < ' ') || ('}' < *(char *)(in_RDI + local_28))) {
          local_39 = '.';
        }
        else {
          local_39 = *(char *)(in_RDI + local_28);
        }
        fprintf(_stderr,"%c",(ulong)(uint)(int)local_39);
      }
      fprintf(_stderr,"\n");
    }
  }
  return;
}

Assistant:

void dbg_print_buf(void *buf, uint64_t buflen, bool hex, int align)
{
    if (!buf) {
        fprintf(stderr, "(null)\n");
        return;
    }

    if (!hex) {
        // plaintext
        fprintf(stderr, "%.*s\n", (int)buflen, (char*)buf);
        return;
    }

    // hex dump
    size_t i, j;
    fprintf(stderr, "(hex) 0x%" _X64 ", %" _F64 " (0x%" _X64 ") bytes\n",
            (uint64_t)buf, buflen, buflen);
    for (i=0;i<buflen;i+=align) {
        fprintf(stderr, "   %04x   ", (int)i);
        for (j=i; j<i+align; ++j){
            if (j<buflen) {
                fprintf(stderr, "%02x ", ((uint8_t*)buf)[j]);
            } else {
                fprintf(stderr, "   ");
            }
            if ((j+1)%8 == 0) {
                fprintf(stderr, " ");
            }
        }
        fprintf(stderr, " ");
        for (j=i; j<i+align && j<buflen; ++j){
            // print only readable ascii character
            fprintf(stderr, "%c",
             (0x20 <= ((char*)buf)[j] && ((char*)buf)[j] <= 0x7d)?
                       ((char*)buf)[j] : '.'  );
        }
        fprintf(stderr, "\n");
    }
}